

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.cpp
# Opt level: O3

int tremove(lua_State *L)

{
  size_t sVar1;
  ulong uVar2;
  int iVar3;
  uint n;
  uint n_00;
  int n_01;
  
  luaL_checktype(L,1,5);
  sVar1 = lua_objlen(L,1);
  n_00 = (uint)sVar1;
  uVar2 = luaL_optinteger(L,2,(long)(int)n_00);
  n_01 = (int)uVar2;
  iVar3 = 0;
  if (n_01 <= (int)n_00 && 0 < n_01) {
    iVar3 = 1;
    lua_rawgeti(L,1,n_01);
    if (n_01 < (int)n_00) {
      do {
        n = (int)uVar2 + 1;
        lua_rawgeti(L,1,n);
        lua_rawseti(L,1,(int)uVar2);
        uVar2 = (ulong)n;
      } while (n_00 != n);
    }
    lua_pushnil(L);
    lua_rawseti(L,1,n_00);
  }
  return iVar3;
}

Assistant:

static int tremove (lua_State *L) {
  int e = aux_getn(L, 1);
  int pos = luaL_optint(L, 2, e);
  if (!(1 <= pos && pos <= e))  /* position is outside bounds? */
   return 0;  /* nothing to remove */
  luaL_setn(L, 1, e - 1);  /* t.n = n-1 */
  lua_rawgeti(L, 1, pos);  /* result = t[pos] */
  for ( ;pos<e; pos++) {
    lua_rawgeti(L, 1, pos+1);
    lua_rawseti(L, 1, pos);  /* t[pos] = t[pos+1] */
  }
  lua_pushnil(L);
  lua_rawseti(L, 1, e);  /* t[e] = nil */
  return 1;
}